

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# accessors.h
# Opt level: O2

int32_t upb_Message_GetInt32(upb_Message *msg,upb_MiniTableField *f,int32_t default_val)

{
  upb_CType uVar1;
  upb_MessageValue uVar2;
  
  uVar1 = upb_MiniTableField_CType(f);
  if (uVar1 != kUpb_CType_Int32) {
    uVar1 = upb_MiniTableField_CType(f);
    if (uVar1 != kUpb_CType_Enum) {
      __assert_fail("upb_MiniTableField_CType(f) == kUpb_CType_Int32 || upb_MiniTableField_CType(f) == kUpb_CType_Enum"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                    ,399,
                    "int32_t upb_Message_GetInt32(const struct upb_Message *, const upb_MiniTableField *, int32_t)"
                   );
    }
  }
  uVar2._8_8_ = (ulong)CONCAT31((int3)(uVar1 >> 8),f->mode_dont_copy_me__upb_internal_use_only) &
                0xffffffffffffff03;
  if ((char)uVar2._8_8_ == '\x02') {
    if ((f->mode_dont_copy_me__upb_internal_use_only & 0xc0) == 0x40) {
      uVar2.int64_val._4_4_ = 0;
      uVar2.int32_val = default_val;
      uVar2 = upb_Message_GetField(msg,f,uVar2);
      return uVar2._0_4_;
    }
    __assert_fail("_upb_MiniTableField_GetRep_dont_copy_me__upb_internal_use_only(f) == kUpb_FieldRep_4Byte"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                  ,0x191,
                  "int32_t upb_Message_GetInt32(const struct upb_Message *, const upb_MiniTableField *, int32_t)"
                 );
  }
  __assert_fail("upb_MiniTableField_IsScalar(f)",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/message/internal/accessors.h"
                ,400,
                "int32_t upb_Message_GetInt32(const struct upb_Message *, const upb_MiniTableField *, int32_t)"
               );
}

Assistant:

UPB_API_INLINE int32_t upb_Message_GetInt32(const struct upb_Message* msg,
                                            const upb_MiniTableField* f,
                                            int32_t default_val) {
  UPB_ASSUME(upb_MiniTableField_CType(f) == kUpb_CType_Int32 ||
             upb_MiniTableField_CType(f) == kUpb_CType_Enum);
  UPB_ASSUME(upb_MiniTableField_IsScalar(f));
  UPB_ASSUME(UPB_PRIVATE(_upb_MiniTableField_GetRep)(f) == kUpb_FieldRep_4Byte);

  upb_MessageValue def;
  def.int32_val = default_val;
  return upb_Message_GetField(msg, f, def).int32_val;
}